

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSurfaceAccess.cpp
# Opt level: O3

void __thiscall
tcu::SurfaceAccess::SurfaceAccess
          (SurfaceAccess *this,Surface *surface,PixelFormat *colorFmt,int x,int y,int width,
          int height)

{
  this->m_surface = surface;
  this->m_colorMask =
       (colorFmt->alphaBits != 0) << 3 |
       (colorFmt->blueBits != 0) << 2 | (colorFmt->greenBits != 0) * '\x02' | colorFmt->redBits != 0
  ;
  this->m_x = x;
  this->m_y = y;
  this->m_width = width;
  this->m_height = height;
  return;
}

Assistant:

SurfaceAccess::SurfaceAccess (tcu::Surface& surface, const tcu::PixelFormat& colorFmt, int x, int y, int width, int height)
	: m_surface		(&surface)
	, m_colorMask	(getColorMask(colorFmt))
	, m_x			(x)
	, m_y			(y)
	, m_width		(width)
	, m_height		(height)
{
}